

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Framebuffers::TextureAttachmentErrorsTest::ExpectError
          (TextureAttachmentErrorsTest *this,GLenum expected_error,GLchar *function_name,
          bool framebuffer,bool attachment,bool color_attachment,bool texture,bool level,
          GLchar *texture_type,bool layer)

{
  GLenum GVar1;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar4;
  Enum<int,_2UL> EVar5;
  Enum<int,_2UL> local_228;
  GetNameFunc local_218;
  int local_210;
  Enum<int,_2UL> local_208;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0 [3];
  MessageBuilder local_1b8;
  GLenum local_38;
  byte local_31;
  GLenum error;
  bool is_ok;
  Functions *gl;
  bool layer_local;
  bool level_local;
  bool texture_local;
  bool color_attachment_local;
  bool attachment_local;
  GLchar *pGStack_20;
  bool framebuffer_local;
  GLchar *function_name_local;
  TextureAttachmentErrorsTest *pTStack_10;
  GLenum expected_error_local;
  TextureAttachmentErrorsTest *this_local;
  
  gl._4_1_ = texture;
  gl._3_1_ = level;
  gl._2_1_ = layer;
  gl._5_1_ = color_attachment;
  gl._6_1_ = attachment;
  gl._7_1_ = framebuffer;
  pGStack_20 = function_name;
  function_name_local._4_4_ = expected_error;
  pTStack_10 = this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  GVar1 = function_name_local._4_4_;
  _error = CONCAT44(extraout_var,iVar2);
  local_31 = 1;
  local_38 = 0;
  local_38 = (**(code **)(_error + 0x800))();
  if (GVar1 != local_38) {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1b8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<(&local_1b8,&stack0xffffffffffffffe0);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [14])0x2a6b30c);
    local_1d0[0] = "invalid";
    if ((gl._7_1_ & 1) != 0) {
      local_1d0[0] = "valid";
    }
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,local_1d0);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [15])" framebuffer, ");
    local_1d8 = "invalid";
    if ((gl._6_1_ & 1) != 0) {
      local_1d8 = "valid";
    }
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1d8);
    local_1e0 = "";
    if ((gl._5_1_ & 1) != 0) {
      local_1e0 = " color";
    }
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1e0);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [14])" attachment, ");
    local_1e8 = "invalid ";
    if ((gl._4_1_ & 1) != 0) {
      local_1e8 = "valid ";
    }
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1e8);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&texture_type);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [11])0x2b714a2);
    local_1f0 = "invalid";
    if ((gl._3_1_ & 1) != 0) {
      local_1f0 = "valid";
    }
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1f0);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [7])0x2a5ba7e);
    local_1f8 = ", with invalid layer number";
    if ((gl._2_1_ & 1) != 0) {
      local_1f8 = "";
    }
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_1f8);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [27])0x2a6bbe5);
    EVar5 = glu::getErrorStr(function_name_local._4_4_);
    local_218 = EVar5.m_getName;
    local_210 = EVar5.m_value;
    local_208.m_getName = local_218;
    local_208.m_value = local_210;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_208);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [7])0x2a6afaf);
    EVar5 = glu::getErrorStr(local_38);
    local_228.m_getName = EVar5.m_getName;
    local_228.m_value = EVar5.m_value;
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_228);
    pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [23])" was observed instead.");
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b8);
    local_31 = 0;
  }
  do {
    iVar2 = (**(code **)(_error + 0x800))();
  } while (iVar2 != 0);
  return (bool)(local_31 & 1);
}

Assistant:

bool TextureAttachmentErrorsTest::ExpectError(glw::GLenum expected_error, const glw::GLchar* function_name,
											  bool framebuffer, bool attachment, bool color_attachment, bool texture,
											  bool level, const glw::GLchar* texture_type, bool layer)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	bool is_ok = true;

	glw::GLenum error = GL_NO_ERROR;

	if (expected_error != (error = gl.getError()))
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << function_name << " called with " << (framebuffer ? "valid" : "invalid")
			<< " framebuffer, " << (attachment ? "valid" : "invalid") << (color_attachment ? " color" : "")
			<< " attachment, " << (texture ? "valid " : "invalid ") << texture_type << " texture, "
			<< (level ? "valid" : "invalid") << " level" << (layer ? "" : ", with invalid layer number")
			<< " was expected to generate " << glu::getErrorStr(expected_error) << ", but " << glu::getErrorStr(error)
			<< " was observed instead." << tcu::TestLog::EndMessage;

		is_ok = false;
	}

	/* Clean additional possible errors. */
	while (gl.getError())
		;

	return is_ok;
}